

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O1

void __thiscall VGMPlayer::Cmd_Port_Reg8_Data8(VGMPlayer *this)

{
  UINT8 UVar1;
  UINT8 UVar2;
  UINT8 *pUVar3;
  CHIP_DEVICE *pCVar4;
  ulong uVar5;
  
  pCVar4 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if ((pCVar4 != (CHIP_DEVICE *)0x0) && (pCVar4->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    pUVar3 = this->_fileData;
    uVar5 = (ulong)this->_filePos;
    UVar1 = pUVar3[uVar5 + 1];
    UVar2 = pUVar3[uVar5 + 3];
    (*pCVar4->write8)((pCVar4->base).defInf.dataPtr,UVar1 * '\x02',pUVar3[uVar5 + 2]);
    (*pCVar4->write8)((pCVar4->base).defInf.dataPtr,UVar1 * '\x02' + '\x01',UVar2);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_Port_Reg8_Data8(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	SendYMCommand(cDev, fData[0x01] & 0x7F, fData[0x02], fData[0x03]);
	return;
}